

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O3

void __thiscall
duckdb::CheckpointReader::LoadCheckpoint
          (CheckpointReader *this,CatalogTransaction transaction,MetadataReader *reader)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  BinaryDeserializer deserializer;
  undefined1 local_2b8 [224];
  _Elt_pointer local_1d8;
  _Elt_pointer local_1c8;
  MetadataReader *local_40;
  idx_t local_38;
  bool local_30;
  field_id_t local_2e;
  
  local_2b8._0_8_ = &PTR__Deserializer_02436e98;
  local_2b8[8] = false;
  SerializationData::SerializationData((SerializationData *)(local_2b8 + 0x10));
  local_2b8._0_8_ = &PTR__Deserializer_02436cf8;
  local_38 = 0;
  local_30 = false;
  local_2e = 0;
  local_2b8[8] = false;
  local_40 = reader;
  if (local_1d8 == local_1c8 + -1) {
    ::std::
    deque<std::reference_wrapper<duckdb::Catalog>,std::allocator<std::reference_wrapper<duckdb::Catalog>>>
    ::_M_push_back_aux<duckdb::Catalog&>
              ((deque<std::reference_wrapper<duckdb::Catalog>,std::allocator<std::reference_wrapper<duckdb::Catalog>>>
                *)(local_2b8 + 0xb0),this->catalog);
  }
  else {
    local_1d8->_M_data = this->catalog;
    local_1d8 = local_1d8 + 1;
  }
  BinaryDeserializer::OnObjectBegin((BinaryDeserializer *)local_2b8);
  (**(_func_int **)(local_2b8._0_8_ + 0x10))(local_2b8,100,"catalog_entries");
  iVar1 = (**(_func_int **)(local_2b8._0_8_ + 0x40))();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    do {
      (**(_func_int **)(local_2b8._0_8_ + 0x30))(local_2b8);
      (*this->_vptr_CheckpointReader[3])(this,local_2b8);
      (**(_func_int **)(local_2b8._0_8_ + 0x38))(local_2b8);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (**(_func_int **)(local_2b8._0_8_ + 0x48))();
  (**(_func_int **)(local_2b8._0_8_ + 0x18))();
  BinaryDeserializer::OnObjectEnd((BinaryDeserializer *)local_2b8);
  Deserializer::Unset<duckdb::Catalog>((Deserializer *)local_2b8);
  Deserializer::~Deserializer((Deserializer *)local_2b8);
  return;
}

Assistant:

void CheckpointReader::LoadCheckpoint(CatalogTransaction transaction, MetadataReader &reader) {
	BinaryDeserializer deserializer(reader);
	deserializer.Set<Catalog &>(catalog);
	deserializer.Begin();
	deserializer.ReadList(100, "catalog_entries", [&](Deserializer::List &list, idx_t i) {
		return list.ReadObject([&](Deserializer &obj) { ReadEntry(transaction, obj); });
	});
	deserializer.End();
	deserializer.Unset<Catalog>();
}